

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O2

int ssyrk_(char *uplo,char *trans,integer *n,integer *k,real *alpha,real *a,integer *lda,real *beta,
          real *c__,integer *ldc)

{
  float fVar1;
  uint uVar2;
  logical lVar3;
  logical lVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  real *prVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  real *prVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  real *prVar23;
  float fVar24;
  real *local_50;
  
  uVar5 = (ulong)*lda;
  uVar6 = (ulong)*ldc;
  lVar3 = lsame_(trans,"N");
  puVar7 = (uint *)n;
  if (lVar3 == 0) {
    puVar7 = (uint *)k;
  }
  uVar13 = *puVar7;
  lVar3 = lsame_(uplo,"U");
  ssyrk_::info = 0;
  uVar19 = 1;
  if ((lVar3 != 0) || (lVar4 = lsame_(uplo,"L"), lVar4 != 0)) {
    lVar4 = lsame_(trans,"N");
    if ((lVar4 == 0) &&
       ((lVar4 = lsame_(trans,"T"), lVar4 == 0 && (lVar4 = lsame_(trans,"C"), lVar4 == 0)))) {
      uVar19 = 2;
    }
    else {
      uVar16 = *n;
      if ((int)uVar16 < 0) {
        uVar19 = 3;
      }
      else if (*k < 0) {
        uVar19 = 4;
      }
      else {
        if ((int)uVar13 < 2) {
          uVar13 = uVar19;
        }
        if (*lda < (int)uVar13) {
          uVar19 = 7;
        }
        else {
          if (1 < uVar16) {
            uVar19 = uVar16;
          }
          if (*ldc < (int)uVar19) {
            uVar19 = 10;
          }
          else {
            uVar19 = ssyrk_::info;
            if (ssyrk_::info == 0) {
              if ((ulong)uVar16 == 0) {
                return 0;
              }
              uVar20 = ~uVar6;
              if ((*alpha == 0.0) && (!NAN(*alpha))) {
                fVar1 = *beta;
                if ((fVar1 == 1.0) && (!NAN(fVar1))) {
                  return 0;
                }
                if (lVar3 != 0) {
                  lVar8 = (ulong)uVar16 + 1;
                  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                    prVar11 = c__ + uVar6 + uVar20 + 1;
                    for (lVar12 = 1; lVar12 != lVar8; lVar12 = lVar12 + 1) {
                      for (lVar17 = 0; lVar12 != lVar17; lVar17 = lVar17 + 1) {
                        prVar11[lVar17] = 0.0;
                      }
                      prVar11 = prVar11 + uVar6;
                    }
                    return 0;
                  }
                  prVar11 = c__ + uVar6 + uVar20 + 1;
                  for (lVar12 = 1; lVar12 != lVar8; lVar12 = lVar12 + 1) {
                    for (lVar17 = 0; lVar12 != lVar17; lVar17 = lVar17 + 1) {
                      prVar11[lVar17] = *beta * prVar11[lVar17];
                    }
                    prVar11 = prVar11 + uVar6;
                  }
                  return 0;
                }
                uVar5 = (ulong)(uVar16 + 1);
                if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                  prVar11 = c__ + uVar6 + uVar20;
                  uVar20 = uVar5;
                  for (uVar18 = 1; uVar21 = 1, uVar18 != uVar5; uVar18 = uVar18 + 1) {
                    for (; uVar20 != uVar21; uVar21 = uVar21 + 1) {
                      prVar11[uVar21] = 0.0;
                    }
                    prVar11 = prVar11 + uVar6 + 1;
                    uVar20 = uVar20 - 1;
                  }
                  return 0;
                }
                prVar11 = c__ + uVar6 + uVar20;
                uVar20 = uVar5;
                for (uVar18 = 1; uVar21 = 1, uVar18 != uVar5; uVar18 = uVar18 + 1) {
                  for (; uVar20 != uVar21; uVar21 = uVar21 + 1) {
                    prVar11[uVar21] = *beta * prVar11[uVar21];
                  }
                  prVar11 = prVar11 + uVar6 + 1;
                  uVar20 = uVar20 - 1;
                }
                return 0;
              }
              if ((*k == 0) && ((*beta == 1.0 && (!NAN(*beta))))) {
                return 0;
              }
              uVar18 = ~uVar5;
              lVar4 = lsame_(trans,"N");
              uVar13 = *n;
              if (lVar4 != 0) {
                if (lVar3 != 0) {
                  if ((int)uVar13 < 1) {
                    uVar13 = 0;
                  }
                  prVar11 = c__ + uVar20 + uVar6 + 1;
                  for (uVar21 = 1; uVar21 != uVar13 + 1; uVar21 = uVar21 + 1) {
                    fVar1 = *beta;
                    if ((fVar1 != 0.0) || (NAN(fVar1))) {
                      if ((fVar1 != 1.0) || (NAN(fVar1))) {
                        for (uVar9 = 0; uVar21 != uVar9; uVar9 = uVar9 + 1) {
                          prVar11[uVar9] = *beta * prVar11[uVar9];
                        }
                      }
                    }
                    else {
                      for (uVar9 = 0; uVar21 != uVar9; uVar9 = uVar9 + 1) {
                        prVar11[uVar9] = 0.0;
                      }
                    }
                    iVar14 = *k;
                    if (iVar14 < 1) {
                      iVar14 = 0;
                    }
                    prVar15 = a + uVar5 + uVar18 + 1;
                    for (uVar9 = 1; uVar9 != iVar14 + 1; uVar9 = uVar9 + 1) {
                      fVar1 = a[uVar18 + uVar21 + uVar9 * uVar5];
                      if ((fVar1 != 0.0) || (NAN(fVar1))) {
                        fVar24 = *alpha;
                        ssyrk_::temp = fVar1 * fVar24;
                        for (uVar10 = 0; uVar21 != uVar10; uVar10 = uVar10 + 1) {
                          c__[uVar20 + uVar21 * uVar6 + uVar10 + 1] =
                               prVar15[uVar10] * fVar1 * fVar24 +
                               c__[uVar20 + uVar21 * uVar6 + uVar10 + 1];
                        }
                      }
                      prVar15 = prVar15 + uVar5;
                    }
                    prVar11 = prVar11 + uVar6;
                  }
                  return 0;
                }
                uVar21 = (ulong)(uVar13 + 1);
                uVar19 = 0;
                if (0 < (int)uVar13) {
                  uVar19 = uVar13;
                }
                prVar11 = c__ + uVar20 + uVar6;
                prVar15 = c__ + uVar20;
                local_50 = a + uVar5 + uVar18;
                lVar8 = 1;
                lVar12 = 0;
                uVar16 = 0;
                while( true ) {
                  local_50 = local_50 + 1;
                  prVar15 = prVar15 + 1;
                  uVar2 = uVar16;
                  if ((int)uVar16 < (int)uVar13) {
                    uVar2 = uVar13;
                  }
                  if (uVar16 == uVar19) break;
                  fVar1 = *beta;
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    if ((fVar1 != 1.0) || (NAN(fVar1))) {
                      for (uVar20 = 1; uVar21 != uVar20; uVar20 = uVar20 + 1) {
                        prVar11[uVar20] = *beta * prVar11[uVar20];
                      }
                    }
                  }
                  else {
                    for (uVar20 = 1; uVar21 != uVar20; uVar20 = uVar20 + 1) {
                      prVar11[uVar20] = 0.0;
                    }
                  }
                  iVar14 = *k;
                  if (iVar14 < 1) {
                    iVar14 = 0;
                  }
                  prVar23 = local_50;
                  for (uVar20 = 1; uVar20 != iVar14 + 1; uVar20 = uVar20 + 1) {
                    fVar1 = a[uVar18 + lVar8 + uVar20 * uVar5];
                    if ((fVar1 != 0.0) || (NAN(fVar1))) {
                      fVar24 = *alpha;
                      ssyrk_::temp = fVar1 * fVar24;
                      for (lVar17 = 0; (ulong)uVar2 + lVar12 != lVar17; lVar17 = lVar17 + 1) {
                        prVar15[lVar8 * uVar6 + lVar17] =
                             prVar23[lVar17] * fVar1 * fVar24 + prVar15[lVar8 * uVar6 + lVar17];
                      }
                    }
                    prVar23 = prVar23 + uVar5;
                  }
                  lVar8 = lVar8 + 1;
                  uVar16 = uVar16 + 1;
                  prVar11 = prVar11 + uVar6 + 1;
                  uVar21 = uVar21 - 1;
                  lVar12 = lVar12 + -1;
                }
                return 0;
              }
              uVar19 = 0;
              if (0 < (int)uVar13) {
                uVar19 = uVar13;
              }
              if (lVar3 != 0) {
                uVar21 = 2;
                prVar11 = a + uVar5 + uVar18 + 1;
                for (uVar9 = 1; uVar9 != uVar19 + 1; uVar9 = uVar9 + 1) {
                  uVar13 = *k;
                  if (*k < 1) {
                    uVar13 = 0;
                  }
                  prVar15 = a + uVar5 + uVar18 + 1;
                  for (uVar10 = 1; uVar10 != uVar21; uVar10 = uVar10 + 1) {
                    ssyrk_::temp = 0.0;
                    for (uVar22 = 0; uVar13 != uVar22; uVar22 = uVar22 + 1) {
                      ssyrk_::temp = ssyrk_::temp + prVar15[uVar22] * prVar11[uVar22];
                    }
                    fVar1 = *beta;
                    fVar24 = *alpha * ssyrk_::temp;
                    if ((fVar1 != 0.0) || (NAN(fVar1))) {
                      fVar24 = fVar24 + fVar1 * c__[uVar20 + uVar9 * uVar6 + uVar10];
                    }
                    c__[uVar20 + uVar9 * uVar6 + uVar10] = fVar24;
                    prVar15 = prVar15 + uVar5;
                  }
                  uVar21 = uVar21 + 1;
                  prVar11 = prVar11 + uVar5;
                }
                return 0;
              }
              prVar11 = a + uVar5 + uVar18 + 1;
              for (uVar18 = 1; uVar18 != uVar19 + 1; uVar18 = uVar18 + 1) {
                prVar15 = prVar11;
                for (uVar21 = uVar18; uVar21 != uVar13 + 1; uVar21 = uVar21 + 1) {
                  ssyrk_::temp = 0.0;
                  uVar16 = *k;
                  if (*k < 1) {
                    uVar16 = 0;
                  }
                  for (uVar9 = 0; uVar16 != uVar9; uVar9 = uVar9 + 1) {
                    ssyrk_::temp = ssyrk_::temp + prVar15[uVar9] * prVar11[uVar9];
                  }
                  fVar1 = *beta;
                  fVar24 = ssyrk_::temp * *alpha;
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    fVar24 = fVar24 + fVar1 * c__[uVar20 + uVar18 * uVar6 + uVar21];
                  }
                  c__[uVar20 + uVar18 * uVar6 + uVar21] = fVar24;
                  prVar15 = prVar15 + uVar5;
                }
                prVar11 = prVar11 + uVar5;
              }
              return 0;
            }
          }
        }
      }
    }
  }
  ssyrk_::info = uVar19;
  xerbla_("SSYRK ",&ssyrk_::info);
  return 0;
}

Assistant:

int ssyrk_(char *uplo, char *trans, integer *n, integer *k,
	real *alpha, real *a, integer *lda, real *beta, real *c__, integer *
	ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, c_dim1, c_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, l, info;
    static real temp;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYRK  performs one of the symmetric rank k operations

       C := alpha*A*A' + beta*C,

    or

       C := alpha*A'*A + beta*C,

    where  alpha and beta  are scalars, C is an  n by n  symmetric matrix
    and  A  is an  n by k  matrix in the first case and a  k by n  matrix
    in the second case.

    Parameters
    ==========

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of the  array  C  is to be  referenced  as
             follows:

                UPLO = 'U' or 'u'   Only the  upper triangular part of  C
                                    is to be referenced.

                UPLO = 'L' or 'l'   Only the  lower triangular part of  C
                                    is to be referenced.

             Unchanged on exit.

    TRANS  - CHARACTER*1.
             On entry,  TRANS  specifies the operation to be performed as
             follows:

                TRANS = 'N' or 'n'   C := alpha*A*A' + beta*C.

                TRANS = 'T' or 't'   C := alpha*A'*A + beta*C.

                TRANS = 'C' or 'c'   C := alpha*A'*A + beta*C.

             Unchanged on exit.

    N      - INTEGER.
             On entry,  N specifies the order of the matrix C.  N must be
             at least zero.
             Unchanged on exit.

    K      - INTEGER.
             On entry with  TRANS = 'N' or 'n',  K  specifies  the number
             of  columns   of  the   matrix   A,   and  on   entry   with
             TRANS = 'T' or 't' or 'C' or 'c',  K  specifies  the  number
             of rows of the matrix  A.  K must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             k  when  TRANS = 'N' or 'n',  and is  n  otherwise.
             Before entry with  TRANS = 'N' or 'n',  the  leading  n by k
             part of the array  A  must contain the matrix  A,  otherwise
             the leading  k by n  part of the array  A  must contain  the
             matrix A.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in  the  calling  (sub)  program.   When  TRANS = 'N' or 'n'
             then  LDA must be at least  max( 1, n ), otherwise  LDA must
             be at least  max( 1, k ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry, BETA specifies the scalar beta.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry  with  UPLO = 'U' or 'u',  the leading  n by n
             upper triangular part of the array C must contain the upper
             triangular part  of the  symmetric matrix  and the strictly
             lower triangular part of C is not referenced.  On exit, the
             upper triangular part of the array  C is overwritten by the
             upper triangular part of the updated matrix.
             Before entry  with  UPLO = 'L' or 'l',  the leading  n by n
             lower triangular part of the array C must contain the lower
             triangular part  of the  symmetric matrix  and the strictly
             upper triangular part of C is not referenced.  On exit, the
             lower triangular part of the array  C is overwritten by the
             lower triangular part of the updated matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, n ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(trans, "N")) {
	nrowa = *n;
    } else {
	nrowa = *k;
    }
    upper = lsame_(uplo, "U");

    info = 0;
    if (! upper && ! lsame_(uplo, "L")) {
	info = 1;
    } else if (! lsame_(trans, "N") && ! lsame_(trans,
	    "T") && ! lsame_(trans, "C")) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*k < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldc < max(1,*n)) {
	info = 10;
    }
    if (info != 0) {
	xerbla_("SSYRK ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || ((*alpha == 0.f || *k == 0) && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (upper) {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		    }
/* L20: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		    }
/* L40: */
		}
	    }
	} else {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L70: */
		    }
/* L80: */
		}
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(trans, "N")) {

/*        Form  C := alpha*A*A' + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L90: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L100: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = j;
			for (i__ = 1; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L110: */
			}
		    }
/* L120: */
		}
/* L130: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L140: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L150: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = *n;
			for (i__ = j; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L160: */
			}
		    }
/* L170: */
		}
/* L180: */
	    }
	}
    } else {

/*        Form  C := alpha*A'*A + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = j;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L190: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L200: */
		}
/* L210: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *n;
		for (i__ = j; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L220: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L230: */
		}
/* L240: */
	    }
	}
    }

    return 0;

/*     End of SSYRK . */

}